

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,GraphicsItemFlags flags)

{
  Stream *pSVar1;
  bool bVar2;
  uint in_EDX;
  int i;
  int iVar3;
  undefined4 in_register_00000034;
  QDebug *this;
  long in_FS_OFFSET;
  QDebug local_48;
  undefined1 local_40 [8];
  long local_38;
  
  this = (QDebug *)
         CONCAT44(in_register_00000034,
                  flags.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                  super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDebug::operator<<(this,'(');
  bVar2 = false;
  for (iVar3 = 0; iVar3 != 0x11; iVar3 = iVar3 + 1) {
    if ((1 << ((byte)iVar3 & 0x1f) & in_EDX) != 0) {
      if (bVar2) {
        QDebug::operator<<(this,'|');
      }
      local_48.stream = this->stream;
      *(int *)(local_48.stream + 0x28) = *(int *)(local_48.stream + 0x28) + 1;
      operator<<((Stream *)local_40,(GraphicsItemFlag)&local_48);
      QDebug::~QDebug((QDebug *)local_40);
      QDebug::~QDebug(&local_48);
      bVar2 = true;
    }
  }
  QDebug::operator<<(this,')');
  pSVar1 = this->stream;
  this->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QGraphicsItem::GraphicsItemFlags flags)
{
    debug << '(';
    bool f = false;
    for (int i = 0; i < 17; ++i) {
        if (flags & (1 << i)) {
            if (f)
                debug << '|';
            f = true;
            debug << QGraphicsItem::GraphicsItemFlag(int(flags & (1 << i)));
        }
    }
    debug << ')';
    return debug;
}